

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::base64_encode_abi_cxx11_
          (string *__return_storage_ptr__,utilities *this,void *bytes_to_encode,size_t in_len)

{
  utilities uVar1;
  uchar uVar2;
  undefined6 uVar3;
  ulong uVar4;
  uchar uVar5;
  int jj;
  ulong in_RAX;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  array<unsigned_char,_3UL> char_array_3;
  array<unsigned_char,_4UL> char_array_4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _char_array_3 = in_RAX;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(ulong)((long)bytes_to_encode * 4) / 3 + 2);
  _char_array_3 = _char_array_3 & 0xffffffffff000000;
  _char_array_3 = (_char_array_3 >> 0x10 & 0xffff) << 0x10;
  uVar6 = 0;
  while( true ) {
    iVar8 = (int)uVar6;
    bVar10 = bytes_to_encode == (void *)0x0;
    bytes_to_encode = (void *)((long)bytes_to_encode + -1);
    if (bVar10) break;
    uVar1 = *this;
    this = this + 1;
    *(utilities *)(char_array_3._M_elems + uVar6) = uVar1;
    uVar4 = _char_array_3;
    uVar6 = (ulong)(iVar8 + 1U);
    if (iVar8 + 1U == 3) {
      uVar2 = char_array_3._M_elems[0];
      uVar5 = char_array_3._M_elems[1];
      bVar7 = char_array_3._M_elems[0] >> 2;
      _char_array_3 = CONCAT14(bVar7,_char_array_3);
      _char_array_3 = CONCAT15((uVar2 & 3) << 4 | uVar5 >> 4,_char_array_3);
      uVar3 = _char_array_3;
      char_array_3._M_elems[2] = SUB81(uVar4,2);
      uVar2 = char_array_3._M_elems[2];
      _char_array_3 = CONCAT16((uVar5 & 0xf) << 2 | char_array_3._M_elems[2] >> 6,uVar3);
      _char_array_3 = CONCAT17(uVar2,_char_array_3) & 0x3fffffffffffffff;
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,
                  "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [char_array_4._M_elems[lVar9]]);
      }
      uVar6 = 0;
    }
  }
  if (iVar8 != 0) {
    for (; uVar4 = _char_array_3, (int)uVar6 < 3; uVar6 = uVar6 + 1) {
      char_array_3._M_elems[uVar6] = '\0';
    }
    uVar2 = char_array_3._M_elems[0];
    uVar5 = char_array_3._M_elems[1];
    bVar7 = char_array_3._M_elems[0] >> 2;
    _char_array_3 = CONCAT14(bVar7,_char_array_3);
    _char_array_3 = CONCAT15((uVar2 & 3) << 4 | uVar5 >> 4,_char_array_3);
    uVar3 = _char_array_3;
    char_array_3._M_elems[2] = SUB81(uVar4,2);
    uVar2 = char_array_3._M_elems[2];
    _char_array_3 = CONCAT16((uVar5 & 0xf) << 2 | char_array_3._M_elems[2] >> 6,uVar3);
    _char_array_3 = CONCAT17(uVar2,_char_array_3) & 0x3fffffffffffffff;
    for (lVar9 = 0; lVar9 <= iVar8; lVar9 = lVar9 + 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [char_array_4._M_elems[lVar9]]);
    }
    iVar8 = iVar8 + -1;
    while (iVar8 = iVar8 + 1, iVar8 < 3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,'=');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(void const* bytes_to_encode, size_t in_len)
{
    const auto* b2e = static_cast<const unsigned char*>(bytes_to_encode);
    std::string ret;
    ret.reserve((in_len * 4) / 3 + 2);
    int index{0};
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};

    while (in_len-- != 0) {
        char_array_3[index++] = *b2e++;
        if (index == 3) {
            char_array_4[0] = (char_array_3[0] & 0xfcU) >> 2U;
            char_array_4[1] = ((char_array_3[0] & 0x03U) << 4U) +
                ((char_array_3[1] & 0xf0U) >> 4U);
            char_array_4[2] = ((char_array_3[1] & 0x0fU) << 2U) +
                ((char_array_3[2] & 0xc0U) >> 6U);
            char_array_4[3] = char_array_3[2] & 0x3fU;

            for (index = 0; (index < 4); index++) {
                ret.push_back(base64_chars[char_array_4[index]]);
            }
            index = 0;
        }
    }

    if (index != 0) {
        for (int jj = index; jj < 3; ++jj) {
            char_array_3[jj] = '\0';
        }

        char_array_4[0] = (char_array_3[0] & 0xfcU) >> 2U;
        char_array_4[1] = ((char_array_3[0] & 0x03U) << 4U) +
            ((char_array_3[1] & 0xf0U) >> 4U);
        char_array_4[2] = ((char_array_3[1] & 0x0fU) << 2U) +
            ((char_array_3[2] & 0xc0U) >> 6U);
        char_array_4[3] = char_array_3[2] & 0x3fU;

        for (int jj = 0; (jj < index + 1); ++jj) {
            ret.push_back(base64_chars[char_array_4[jj]]);
        }

        while ((index++ < 3)) {
            ret.push_back('=');
        }
    }

    return ret;
}